

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall Assimp::FBXExporter::WriteHeaderExtension(FBXExporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  tm *ptVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer __dest;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  StreamWriterLE outstream;
  Node CreationTimeStamp;
  stringstream creator;
  time_t rawtime;
  Node n;
  string local_398;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_360;
  shared_ptr<Assimp::IOStream> local_348;
  StreamWriter<false,_false> local_338;
  Node local_300;
  undefined1 local_290 [128];
  ios_base local_210 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  time_t local_a8;
  Node local_a0;
  
  pcVar2 = local_290 + 0x10;
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"FBXHeaderExtension","");
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_290._0_8_,(pointer)(local_290._0_8_ + local_290._8_8_));
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.force_has_children = false;
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  StreamWriter<false,_false>::StreamWriter(&local_338,&local_348,false);
  if (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  FBX::Node::Begin(&local_a0,&local_338,this->binary,0);
  FBX::Node::EndProperties(&local_a0,&local_338,this->binary,0,0);
  FBX::Node::BeginChildren(&local_a0,&local_338,this->binary,0);
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"FBXHeaderVersion","");
  FBX::Node::WritePropertyNode<int>((string *)local_290,0x3eb,&local_338,this->binary,1);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"FBXVersion","");
  FBX::Node::WritePropertyNode<int>((string *)local_290,0x1ce8,&local_338,this->binary,1);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  if (this->binary == true) {
    local_290._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"EncryptionType","");
    FBX::Node::WritePropertyNode<int>((string *)local_290,0,&local_338,this->binary,1);
    if ((pointer)local_290._0_8_ != pcVar2) {
      operator_delete((void *)local_290._0_8_);
    }
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"CreationTimeStamp","");
  paVar3 = &local_300.name.field_2;
  local_300.name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,local_290._0_8_,(pointer)(local_290._0_8_ + local_290._8_8_));
  local_300.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_300.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_300.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_300.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_300.force_has_children = false;
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  time(&local_a8);
  ptVar4 = localtime(&local_a8);
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Version","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,1000);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Year","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_year + 0x76c);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Month","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_mon + 1);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Day","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_mday);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Hour","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_hour);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Minute","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_min);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Second","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,ptVar4->tm_sec);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Millisecond","");
  FBX::Node::AddChild<int>(&local_300,(string *)local_290,0);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_);
  }
  FBX::Node::Dump(&local_300,&local_338,this->binary,1);
  std::__cxx11::stringstream::stringstream((stringstream *)local_290);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_290 + 0x10),"Open Asset Import Library (Assimp) ",0x23);
  aiGetVersionMajor();
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(local_290 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  aiGetVersionMinor();
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  aiGetVersionRevision();
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  paVar1 = &local_398.field_2;
  local_398._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Creator","");
  std::__cxx11::stringbuf::str();
  FBX::Node::WritePropertyNode<std::__cxx11::string>(&local_398,&local_c8,&local_338,this->binary,1)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  FBX::Node::End(&local_a0,&local_338,this->binary,0,true);
  if (this->binary != false) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_360,DAT_009e2978,(allocator_type *)&local_398);
    if (DAT_009e2978 != 0) {
      uVar6 = 0;
      do {
        local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = *(uchar *)(FBX::GENERIC_FILEID_abi_cxx11_ + uVar6)
        ;
        uVar6 = uVar6 + 1;
      } while (uVar6 < DAT_009e2978);
    }
    local_398._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"FileId","");
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = (long)local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar6 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      if ((long)uVar6 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar6);
    }
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __dest + uVar6;
    __n = (long)local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = __dest;
    if (__n != 0) {
      local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest;
      memmove(__dest,local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,__n);
    }
    local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest + __n;
    FBX::Node::WritePropertyNode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_398,&local_378,&local_338,this->binary,0);
    if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar1) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    local_398._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"CreationTime","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,FBX::GENERIC_CTIME_abi_cxx11_,
               DAT_009e2958 + FBX::GENERIC_CTIME_abi_cxx11_);
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_398,&local_108,&local_338,this->binary,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar1) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    local_398._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Creator","");
    std::__cxx11::stringbuf::str();
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_398,&local_e8,&local_338,this->binary,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar1) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    if (local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_290);
  std::ios_base::~ios_base(local_210);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_300.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_300.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_300.name._M_dataplus._M_p);
  }
  StreamWriter<false,_false>::~StreamWriter(&local_338);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_a0.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_a0.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBXExporter::WriteHeaderExtension ()
{
    if (!binary) {
        // no title, follows directly from the top comment
    }
    FBX::Node n("FBXHeaderExtension");
    StreamWriterLE outstream(outfile);
    int indent = 0;

    // begin node
    n.Begin(outstream, binary, indent);

    // write properties
    // (none)

    // finish properties
    n.EndProperties(outstream, binary, indent, 0);

    // begin children
    n.BeginChildren(outstream, binary, indent);

    indent = 1;

    // write child nodes
    FBX::Node::WritePropertyNode(
        "FBXHeaderVersion", int32_t(1003), outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "FBXVersion", int32_t(EXPORT_VERSION_INT), outstream, binary, indent
    );
    if (binary) {
        FBX::Node::WritePropertyNode(
            "EncryptionType", int32_t(0), outstream, binary, indent
        );
    }

    FBX::Node CreationTimeStamp("CreationTimeStamp");
    time_t rawtime;
    time(&rawtime);
    struct tm * now = localtime(&rawtime);
    CreationTimeStamp.AddChild("Version", int32_t(1000));
    CreationTimeStamp.AddChild("Year", int32_t(now->tm_year + 1900));
    CreationTimeStamp.AddChild("Month", int32_t(now->tm_mon + 1));
    CreationTimeStamp.AddChild("Day", int32_t(now->tm_mday));
    CreationTimeStamp.AddChild("Hour", int32_t(now->tm_hour));
    CreationTimeStamp.AddChild("Minute", int32_t(now->tm_min));
    CreationTimeStamp.AddChild("Second", int32_t(now->tm_sec));
    CreationTimeStamp.AddChild("Millisecond", int32_t(0));
    CreationTimeStamp.Dump(outstream, binary, indent);

    std::stringstream creator;
    creator << "Open Asset Import Library (Assimp) " << aiGetVersionMajor()
            << "." << aiGetVersionMinor() << "." << aiGetVersionRevision();
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );

    //FBX::Node sceneinfo("SceneInfo");
    //sceneinfo.AddProperty("GlobalInfo" + FBX::SEPARATOR + "SceneInfo");
    // not sure if any of this is actually needed,
    // so just write an empty node for now.
    //sceneinfo.Dump(outstream, binary, indent);

    indent = 0;

    // finish node
    n.End(outstream, binary, indent, true);

    // that's it for FBXHeaderExtension...
    if (!binary) { return; }

    // but binary files also need top-level FileID, CreationTime, Creator:
    std::vector<uint8_t> raw(GENERIC_FILEID.size());
    for (size_t i = 0; i < GENERIC_FILEID.size(); ++i) {
        raw[i] = uint8_t(GENERIC_FILEID[i]);
    }
    FBX::Node::WritePropertyNode(
        "FileId", raw, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "CreationTime", GENERIC_CTIME, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );
}